

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O0

void __thiscall Assimp::OpenGEX::OpenGEXImporter::resolveReferences(OpenGEXImporter *this)

{
  aiNode *paVar1;
  bool bVar2;
  pointer this_00;
  string *psVar3;
  mapped_type_conflict3 *pmVar4;
  size_type sVar5;
  reference pvVar6;
  Logger *pLVar7;
  DeadlyImportError *this_01;
  allocator<char> local_e9;
  string local_e8;
  uint local_c4;
  iterator iStack_c0;
  uint matIdx;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
  local_b8 [3];
  iterator local_a0;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
  local_98;
  const_iterator it_2;
  string name_1;
  size_t i_1;
  iterator iStack_60;
  uint meshIdx;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
  local_58;
  iterator local_50;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
  local_48;
  const_iterator it_1;
  string *name;
  size_t i;
  aiNode *node;
  __normal_iterator<std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>_>_*,_std::vector<std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>_>,_std::allocator<std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>_>_>_>_>
  local_20;
  iterator it;
  RefInfo *currentRefInfo;
  OpenGEXImporter *this_local;
  
  bVar2 = std::
          vector<std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>_>,_std::allocator<std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>_>_>_>
          ::empty(&this->m_unresolvedRefStack);
  if (!bVar2) {
    it._M_current =
         (unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>_>
          *)0x0;
    local_20._M_current =
         (unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>_>
          *)std::
            vector<std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>_>,_std::allocator<std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>_>_>_>
            ::begin(&this->m_unresolvedRefStack);
    while( true ) {
      node = (aiNode *)
             std::
             vector<std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>_>,_std::allocator<std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>_>_>_>
             ::end(&this->m_unresolvedRefStack);
      bVar2 = __gnu_cxx::operator!=
                        (&local_20,
                         (__normal_iterator<std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>_>_*,_std::vector<std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>_>,_std::allocator<std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>_>_>_>_>
                          *)&node);
      if (!bVar2) break;
      this_00 = __gnu_cxx::
                __normal_iterator<std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>_>_*,_std::vector<std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>_>,_std::allocator<std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>_>_>_>_>
                ::operator->(&local_20);
      it._M_current =
           (unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>_>
            *)std::
              unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>_>
              ::get(this_00);
      if ((pointer)it._M_current != (pointer)0x0) {
        paVar1 = ((pointer)it._M_current)->m_node;
        if (((pointer)it._M_current)->m_type == MeshRef) {
          for (name = (string *)0x0;
              psVar3 = (string *)
                       std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)(it._M_current + 2)), name < psVar3;
              name = (string *)&name->field_0x1) {
            it_1._M_node = (_Base_ptr)
                           std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)(it._M_current + 2),(size_type)name);
            local_50._M_node =
                 (_Base_ptr)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                 ::find(&this->m_mesh2refMap,(key_type *)it_1._M_node);
            std::
            _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
            ::_Rb_tree_const_iterator(&local_48,&local_50);
            iStack_60 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                        ::end(&this->m_mesh2refMap);
            std::
            _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
            ::_Rb_tree_const_iterator(&local_58,&stack0xffffffffffffffa0);
            bVar2 = std::operator!=(&local_58,&local_48);
            if (bVar2) {
              pmVar4 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                       ::operator[](&this->m_mesh2refMap,(key_type *)it_1._M_node);
              paVar1->mMeshes[(long)name] = (uint)*pmVar4;
            }
          }
        }
        else {
          if (((pointer)it._M_current)->m_type != MaterialRef) {
            this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_e8,"Unknown reference info to resolve.",&local_e9);
            DeadlyImportError::DeadlyImportError(this_01,&local_e8);
            __cxa_throw(this_01,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
          }
          for (name_1.field_2._8_8_ = 0;
              sVar5 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)(it._M_current + 2)), (ulong)name_1.field_2._8_8_ < sVar5;
              name_1.field_2._8_8_ = name_1.field_2._8_8_ + 1) {
            pvVar6 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)(it._M_current + 2),name_1.field_2._8_8_);
            std::__cxx11::string::string((string *)&it_2,(string *)pvVar6);
            local_a0._M_node =
                 (_Base_ptr)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                 ::find(&this->m_material2refMap,(key_type *)&it_2);
            std::
            _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
            ::_Rb_tree_const_iterator(&local_98,&local_a0);
            iStack_c0 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                        ::end(&this->m_material2refMap);
            std::
            _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
            ::_Rb_tree_const_iterator(local_b8,&stack0xffffffffffffff40);
            bVar2 = std::operator!=(local_b8,&local_98);
            if (bVar2) {
              if (this->m_currentMesh == (aiMesh *)0x0) {
                pLVar7 = DefaultLogger::get();
                Logger::warn(pLVar7,
                             "Cannot resolve material reference, because no current mesh is there.")
                ;
              }
              else {
                pmVar4 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                         ::operator[](&this->m_material2refMap,(key_type *)&it_2);
                local_c4 = (uint)*pmVar4;
                if (this->m_currentMesh->mMaterialIndex != 0) {
                  pLVar7 = DefaultLogger::get();
                  Logger::warn(pLVar7,
                               "Override of material reference in current mesh by material reference."
                              );
                }
                this->m_currentMesh->mMaterialIndex = local_c4;
              }
            }
            std::__cxx11::string::~string((string *)&it_2);
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>_>_*,_std::vector<std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>_>,_std::allocator<std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>_>_>_>_>
      ::operator++(&local_20);
    }
  }
  return;
}

Assistant:

void OpenGEXImporter::resolveReferences() {
    if( m_unresolvedRefStack.empty() ) {
        return;
    }

    RefInfo *currentRefInfo( nullptr );
    for( auto it = m_unresolvedRefStack.begin(); it != m_unresolvedRefStack.end(); ++it ) {
        currentRefInfo = it->get();
        if( nullptr != currentRefInfo ) {
            aiNode *node( currentRefInfo->m_node );
            if( RefInfo::MeshRef == currentRefInfo->m_type ) {
                for( size_t i = 0; i < currentRefInfo->m_Names.size(); ++i ) {
                    const std::string &name( currentRefInfo->m_Names[ i ] );
                    ReferenceMap::const_iterator it( m_mesh2refMap.find( name ) );
                    if( m_mesh2refMap.end() != it ) {
                        unsigned int meshIdx = static_cast<unsigned int>(m_mesh2refMap[ name ]);
                        node->mMeshes[ i ] = meshIdx;
                    }
                }
            } else if( RefInfo::MaterialRef == currentRefInfo->m_type ) {
                for ( size_t i = 0; i < currentRefInfo->m_Names.size(); ++i ) {
                    const std::string name( currentRefInfo->m_Names[ i ] );
                    ReferenceMap::const_iterator it( m_material2refMap.find( name ) );
                    if ( m_material2refMap.end() != it ) {
                        if ( nullptr != m_currentMesh ) {
                            unsigned int matIdx = static_cast< unsigned int >( m_material2refMap[ name ] );
                            if ( m_currentMesh->mMaterialIndex != 0 ) {
                                ASSIMP_LOG_WARN( "Override of material reference in current mesh by material reference." );
                            }
                            m_currentMesh->mMaterialIndex = matIdx;
                        }  else {
                            ASSIMP_LOG_WARN( "Cannot resolve material reference, because no current mesh is there." );
                        }
                    }
                }
            } else {
                throw DeadlyImportError( "Unknown reference info to resolve." );
            }
        }
    }
}